

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Stats::getArrayAverage
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Stats *this,int index)

{
  iterator __position;
  bool bVar1;
  pointer ppBVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pSVar6;
  RealType v;
  double local_38;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar6 = (this->data_).
           super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppBVar2 = *(pointer *)
             &pSVar6[index].accumulatorArray2d.
              super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
              ._M_impl;
  if (*(pointer *)
       ((long)&pSVar6[index].accumulatorArray2d.
               super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
               ._M_impl + 8) != ppBVar2) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      lVar3 = __dynamic_cast(ppBVar2[uVar4],&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      local_38 = *(double *)(lVar3 + 0x18);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                   &local_38);
        pSVar6 = (this->data_).
                 super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        *__position._M_current = local_38;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      ppBVar2 = *(pointer *)
                 &pSVar6[index].accumulatorArray2d.
                  super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
                  ._M_impl;
      bVar1 = uVar5 < (ulong)((long)*(pointer *)
                                     ((long)&pSVar6[index].accumulatorArray2d.
                                             super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
                                             ._M_impl + 8) - (long)ppBVar2 >> 3);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> Stats::getArrayAverage(int index) {
    assert(index >= 0 && index < ENDINDEX);
    std::vector<RealType> value;
    RealType v;
    for (unsigned int i = 0; i < data_[index].accumulatorArray2d.size(); ++i) {
      dynamic_cast<Accumulator*>(data_[index].accumulatorArray2d[i])
          ->getAverage(v);
      value.push_back(v);
    }
    return value;
  }